

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O2

void __thiscall
Js::ScriptContextPolymorphicInlineCache::Finalize
          (ScriptContextPolymorphicInlineCache *this,bool isShutdown)

{
  size_t *psVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ulong count;
  int i_1;
  uint count_00;
  long lVar6;
  int i;
  ulong uVar7;
  
  if ((this->super_PolymorphicInlineCache).size == 0) {
    if ((this->super_PolymorphicInlineCache).inlineCaches != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                  ,0x41e,"(!inlineCaches)","!inlineCaches");
      if (!bVar4) {
LAB_00896b7a:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  else if ((((this->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr !=
           (ScriptContext *)0x0) {
    if ((this->super_PolymorphicInlineCache).inlineCaches == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                  ,0x42a,"(inlineCaches && size > 0)","inlineCaches && size > 0");
      if (!bVar4) goto LAB_00896b7a;
      *puVar5 = 0;
    }
    if (isShutdown) {
      lVar6 = 0;
      for (uVar7 = 0; uVar7 < (this->super_PolymorphicInlineCache).size; uVar7 = uVar7 + 1) {
        InlineCache::Clear((InlineCache *)
                           ((long)&((this->super_PolymorphicInlineCache).inlineCaches)->u + lVar6));
        lVar6 = lVar6 + 0x20;
      }
      (this->super_PolymorphicInlineCache).inlineCaches = (Type)0x0;
      (this->super_PolymorphicInlineCache).size = 0;
    }
    else {
      lVar6 = 0;
      count_00 = 0;
      for (uVar7 = 0; count = (ulong)(this->super_PolymorphicInlineCache).size, uVar7 < count;
          uVar7 = uVar7 + 1) {
        bVar4 = InlineCache::RemoveFromInvalidationList
                          ((InlineCache *)
                           ((long)&((this->super_PolymorphicInlineCache).inlineCaches)->u + lVar6));
        count_00 = count_00 + bVar4;
        lVar6 = lVar6 + 0x20;
      }
      Memory::DeleteArray<Memory::InlineCacheAllocator,Js::InlineCache>
                (&((((this->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                  ->inlineCacheAllocator,count,(this->super_PolymorphicInlineCache).inlineCaches);
      pSVar2 = (((this->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      psVar1 = &(pSVar2->inlineCacheAllocator).polyCacheAllocSize;
      *psVar1 = *psVar1 + (ulong)(this->super_PolymorphicInlineCache).size * -0x20;
      (this->super_PolymorphicInlineCache).inlineCaches = (Type)0x0;
      (this->super_PolymorphicInlineCache).size = 0;
      if (count_00 != 0) {
        ThreadContext::NotifyInlineCacheBatchUnregistered(pSVar2->threadContext,count_00);
        return;
      }
    }
  }
  return;
}

Assistant:

void ScriptContextPolymorphicInlineCache::Finalize(bool isShutdown)
    {
        if (size == 0)
        {
            // Already finalized
            Assert(!inlineCaches);
            return;
        }
        if (this->javascriptLibrary->scriptContext == nullptr)
        {
            // If caches were made during ScriptContext initialization, and initialization failed the ScriptContext
            // and InlineCacheAllocator will be freed, so we don't need to do anything during finalization
            return;
        }

        uint unregisteredInlineCacheCount = 0;

        Assert(inlineCaches && size > 0);

        // If we're not shutting down (as in closing the script context), we need to remove our inline caches from
        // thread context's invalidation lists, and release memory back to the arena.  During script context shutdown,
        // we leave everything in place, because the inline cache arena will stay alive until script context is destroyed
        // (as in destructor has been called) and thus the invalidation lists are safe to keep references to caches from this
        // script context.  We will, however, zero all inline caches so that we don't have to process them on subsequent
        // collections, which may still happen from other script contexts.
        if (isShutdown)
        {
#if DBG
            for (int i = 0; i < size; i++)
            {
                inlineCaches[i].Clear();
            }
#else
            memset(inlineCaches, 0, size * sizeof(InlineCache));
#endif
        }
        else
        {
            for (int i = 0; i < size; i++)
            {
                if (inlineCaches[i].RemoveFromInvalidationList())
                {
                    unregisteredInlineCacheCount++;
                }
            }
            AllocatorDeleteArray(InlineCacheAllocator, this->javascriptLibrary->scriptContext->GetInlineCacheAllocator(), size, inlineCaches);
#ifdef POLY_INLINE_CACHE_SIZE_STATS
            this->javascriptLibrary->scriptContext->GetInlineCacheAllocator()->LogPolyCacheFree(size * sizeof(InlineCache));
#endif
        }

        inlineCaches = nullptr;
        size = 0;
        if (unregisteredInlineCacheCount > 0)
        {
            this->javascriptLibrary->scriptContext->GetThreadContext()->NotifyInlineCacheBatchUnregistered(unregisteredInlineCacheCount);
        }
    }